

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCast::Operation<duckdb::timestamp_t,_duckdb::timestamp_ns_t>
               (timestamp_t input,timestamp_ns_t *result,bool strict)

{
  bool bVar1;
  byte in_DL;
  int64_t *in_RSI;
  int64_t in_RDI;
  string *in_stack_ffffffffffffff98;
  ConversionException *this;
  allocator local_39;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  bVar1 = TryMultiplyOperator::Operation<long,_long,_long>(in_RDI,1000000,in_RSI);
  if (!bVar1) {
    this = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Could not convert TIMESTAMP to TIMESTAMP_NS",&local_39)
    ;
    ConversionException::ConversionException(this,in_stack_ffffffffffffff98);
    __cxa_throw(this,&ConversionException::typeinfo,ConversionException::~ConversionException);
  }
  return true;
}

Assistant:

bool TryCast::Operation(timestamp_t input, timestamp_ns_t &result, bool strict) {
	D_ASSERT(Timestamp::IsFinite(input));
	if (!TryMultiplyOperator::Operation(input.value, Interval::NANOS_PER_MSEC, result.value)) {
		throw ConversionException("Could not convert TIMESTAMP to TIMESTAMP_NS");
	}
	return true;
}